

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O1

void traverse_tree_sim<PredictionData<double,unsigned_long>,double>
               (WorkerForSimilarity *workspace,
               PredictionData<double,_unsigned_long> *prediction_data,IsoForest *model_outputs,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,size_t curr_tree,bool as_kernel)

{
  ulong *puVar1;
  bool bVar2;
  MissingAction MVar3;
  pointer pIVar4;
  double *pdVar5;
  double *pdVar6;
  pointer pdVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *split_categ;
  char *pcVar12;
  pointer pdVar13;
  pointer puVar14;
  unsigned_long uVar15;
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar16;
  ulong *puVar17;
  ulong uVar18;
  long lVar19;
  size_t *psVar20;
  size_t sVar21;
  long lVar22;
  pointer puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  undefined7 in_register_00000089;
  long lVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  size_t end_NA;
  size_t st_NA;
  size_t split_ix;
  vector<IsoTree,_std::allocator<IsoTree>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  
  if (interrupt_switch) {
    return;
  }
  if (workspace->st == workspace->end) {
    return;
  }
  if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar23 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar14 = puVar23 + workspace->st;
    puVar23 = puVar23 + workspace->end + 1;
    local_70 = trees;
    if (puVar14 != puVar23) {
      uVar18 = (long)puVar23 - (long)puVar14 >> 3;
      lVar19 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar14,puVar23,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar14,puVar23);
    }
    puVar14 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (workspace->n_from <= puVar14[workspace->st]) {
      return;
    }
    trees = local_70;
    if (puVar14[workspace->end] < workspace->n_from) {
      return;
    }
  }
  pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar4[curr_tree].tree_left == 0) {
    dVar29 = pIVar4[curr_tree].remainder;
    pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar5 != (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (!as_kernel) {
        bVar2 = workspace->assume_full_distr;
        if (bVar2 == false) {
          dVar30 = 0.0;
          dVar31 = 0.0;
          if (workspace->st != workspace->end) {
            lVar19 = workspace->st << 3;
            do {
              dVar30 = dVar30 + pdVar5[*(long *)((long)(workspace->ix_arr).
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar19
                                                )];
              lVar19 = lVar19 + 8;
              dVar31 = dVar30;
            } while (workspace->end << 3 != lVar19);
          }
          dVar29 = dVar29 + dVar31;
        }
        pdVar6 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6 == (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          pdVar6 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pdVar6 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            return;
          }
          psVar20 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar21 = workspace->st;
          sVar9 = workspace->end;
          sVar10 = workspace->n_from;
          sVar11 = prediction_data->nrows;
          if (bVar2 == false) {
            dVar29 = expected_separation_depth<double>(dVar29);
          }
          else {
            dVar29 = 3.0;
          }
          increase_comb_counter_in_groups(psVar20,sVar21,sVar9,sVar10,sVar11,pdVar6,pdVar5,dVar29);
          return;
        }
        psVar20 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar21 = workspace->st;
        sVar9 = workspace->end;
        sVar10 = prediction_data->nrows;
        if (bVar2 == false) {
          dVar29 = expected_separation_depth<double>(dVar29);
        }
        else {
          dVar29 = 3.0;
        }
        increase_comb_counter(psVar20,sVar21,sVar9,sVar10,pdVar6,pdVar5,dVar29);
        return;
      }
      pdVar13 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar13 != pdVar7) {
        uVar18 = workspace->end;
        if (uVar18 <= workspace->st) {
          return;
        }
        puVar14 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar19 = (long)pdVar7 - (long)pdVar13 >> 3;
        uVar25 = workspace->st;
        do {
          uVar24 = uVar25 + 1;
          if (uVar25 < uVar18) {
            uVar25 = puVar14[uVar25];
            dVar29 = pdVar5[uVar25];
            sVar21 = prediction_data->nrows;
            lVar22 = sVar21 - uVar25;
            uVar28 = uVar24;
            do {
              uVar8 = puVar14[uVar28];
              if (uVar25 < uVar8) {
                lVar27 = (lVar19 - uVar25) + uVar8 + ~((ulong)((lVar22 + -1) * lVar22) >> 1);
              }
              else {
                lVar27 = sVar21 - uVar8;
                lVar27 = ((uVar25 + lVar19) - uVar8) + ~((ulong)((lVar27 + -1) * lVar27) >> 1);
              }
              pdVar13[lVar27] = pdVar5[uVar8] * dVar29 + pdVar13[lVar27];
              uVar28 = uVar28 + 1;
            } while (uVar28 <= uVar18);
          }
          uVar25 = uVar24;
        } while (uVar24 != uVar18);
        return;
      }
      pdVar13 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar13 ==
          (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      puVar14 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar18 = workspace->st;
      puVar1 = puVar14 + uVar18;
      uVar25 = workspace->end;
      uVar24 = (long)((long)puVar14 + (uVar25 * 8 - (long)puVar1) + 8) >> 3;
      puVar26 = puVar1;
      if (0 < (long)uVar24) {
        do {
          uVar28 = uVar24 >> 1;
          uVar24 = ~uVar28 + uVar24;
          puVar17 = puVar26 + uVar28 + 1;
          if (workspace->n_from <= puVar26[uVar28]) {
            uVar24 = uVar28;
            puVar17 = puVar26;
          }
          puVar26 = puVar17;
        } while (0 < (long)uVar24);
      }
      uVar24 = ((long)puVar26 - (long)puVar1 >> 3) + uVar18;
      if (uVar24 <= uVar18) {
        return;
      }
      sVar21 = workspace->n_from;
      do {
        if (uVar24 <= uVar25) {
          lVar19 = sVar21 * puVar14[uVar18];
          dVar29 = pdVar5[puVar14[uVar18]];
          uVar28 = uVar24;
          do {
            lVar22 = puVar14[uVar28] - sVar21;
            pdVar13[lVar19 + lVar22] = pdVar5[puVar14[uVar28]] * dVar29 + pdVar13[lVar19 + lVar22];
            uVar28 = uVar28 + 1;
          } while (uVar28 <= uVar25);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar24);
      return;
    }
    if (!as_kernel) {
      sVar21 = workspace->st;
      sVar9 = workspace->end;
      lVar19 = (sVar9 - sVar21) + 1;
      auVar32._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar32._0_8_ = lVar19;
      auVar32._12_4_ = 0x45300000;
      dVar29 = dVar29 + (auVar32._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
      pdVar5 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 != (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        psVar20 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar10 = prediction_data->nrows;
        if (workspace->assume_full_distr == false) {
          dVar29 = expected_separation_depth<double>(dVar29);
        }
        else {
          dVar29 = 3.0;
        }
        increase_comb_counter(psVar20,sVar21,sVar9,sVar10,pdVar5,dVar29);
        return;
      }
      pdVar5 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      psVar20 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar10 = workspace->n_from;
      sVar11 = prediction_data->nrows;
      if (workspace->assume_full_distr == false) {
        dVar29 = expected_separation_depth<double>(dVar29);
      }
      else {
        dVar29 = 3.0;
      }
      increase_comb_counter_in_groups(psVar20,sVar21,sVar9,sVar10,sVar11,pdVar5,dVar29);
      return;
    }
    pdVar13 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar7 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar13 != pdVar7) {
      uVar18 = workspace->end;
      if (uVar18 <= workspace->st) {
        return;
      }
      puVar14 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar19 = (long)pdVar7 - (long)pdVar13 >> 3;
      uVar25 = workspace->st;
      do {
        uVar24 = uVar25 + 1;
        if (uVar25 < uVar18) {
          uVar25 = puVar14[uVar25];
          sVar21 = prediction_data->nrows;
          lVar22 = sVar21 - uVar25;
          uVar28 = uVar24;
          do {
            uVar8 = puVar14[uVar28];
            if (uVar25 < uVar8) {
              lVar27 = uVar8 + (lVar19 - uVar25) + ~((ulong)((lVar22 + -1) * lVar22) >> 1);
            }
            else {
              lVar27 = sVar21 - uVar8;
              lVar27 = ((uVar25 + lVar19) - uVar8) + ~((ulong)((lVar27 + -1) * lVar27) >> 1);
            }
            pdVar13[lVar27] = pdVar13[lVar27] + 1.0;
            uVar28 = uVar28 + 1;
          } while (uVar28 <= uVar18);
        }
        uVar25 = uVar24;
      } while (uVar24 != uVar18);
      return;
    }
    pdVar13 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pdVar13 ==
        (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    puVar14 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar18 = workspace->st;
    puVar1 = puVar14 + uVar18;
    uVar25 = workspace->end;
    uVar24 = (long)((long)puVar14 + (uVar25 * 8 - (long)puVar1) + 8) >> 3;
    puVar26 = puVar1;
    if (0 < (long)uVar24) {
      do {
        uVar28 = uVar24 >> 1;
        uVar24 = ~uVar28 + uVar24;
        puVar17 = puVar26 + uVar28 + 1;
        if (workspace->n_from <= puVar26[uVar28]) {
          uVar24 = uVar28;
          puVar17 = puVar26;
        }
        puVar26 = puVar17;
      } while (0 < (long)uVar24);
    }
    uVar24 = ((long)puVar26 - (long)puVar1 >> 3) + uVar18;
    if (uVar24 <= uVar18) {
      return;
    }
    sVar21 = workspace->n_from;
    do {
      if (uVar24 <= uVar25) {
        lVar19 = puVar14[uVar18] * sVar21;
        uVar28 = uVar24;
        do {
          lVar22 = puVar14[uVar28] - sVar21;
          pdVar13[lVar19 + lVar22] = pdVar13[lVar19 + lVar22] + 1.0;
          uVar28 = uVar28 + 1;
        } while (uVar28 <= uVar25);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar24);
    return;
  }
  if (curr_tree != 0 && !as_kernel) {
    pdVar5 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar5 == (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pdVar5 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 != (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pdVar6 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        psVar20 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pdVar6 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          increase_comb_counter_in_groups
                    (psVar20,workspace->st,workspace->end,workspace->n_from,prediction_data->nrows,
                     pdVar5,-1.0);
        }
        else {
          increase_comb_counter_in_groups
                    (psVar20,workspace->st,workspace->end,workspace->n_from,prediction_data->nrows,
                     pdVar5,pdVar6,-1.0);
        }
      }
    }
    else {
      pdVar6 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      psVar20 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar6 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        increase_comb_counter
                  (psVar20,workspace->st,workspace->end,prediction_data->nrows,pdVar5,-1.0);
      }
      else {
        increase_comb_counter
                  (psVar20,workspace->st,workspace->end,prediction_data->nrows,pdVar5,pdVar6,-1.0);
      }
    }
  }
  local_70 = (vector<IsoTree,_std::allocator<IsoTree>_> *)
             CONCAT44(local_70._4_4_,(int)CONCAT71(in_register_00000089,as_kernel));
  if ((prediction_data->Xc_indptr != (unsigned_long *)0x0) &&
     ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    puVar23 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar14 = puVar23 + workspace->st;
    puVar23 = puVar23 + workspace->end + 1;
    if (puVar14 != puVar23) {
      uVar18 = (long)puVar23 - (long)puVar14 >> 3;
      lVar19 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar14,puVar23,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar14,puVar23);
    }
  }
  pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar4[curr_tree].col_type == Categorical) {
    if (model_outputs->cat_split_type == SubSet) {
      split_categ = pIVar4[curr_tree].cat_split.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      pcVar12 = *(pointer *)
                 ((long)&pIVar4[curr_tree].cat_split.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8);
      if (pcVar12 == split_categ) {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar4[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            workspace->end,model_outputs->missing_action,
                            model_outputs->new_cat_action,
                            pIVar4[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar4[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
      else {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar4[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            workspace->end,split_categ,(int)pcVar12 - (int)split_categ,
                            model_outputs->missing_action,model_outputs->new_cat_action,
                            pIVar4[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar4[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
    }
    else if (model_outputs->cat_split_type == SingleCateg) {
      divide_subset_split((workspace->ix_arr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          prediction_data->categ_data +
                          pIVar4[curr_tree].col_num * prediction_data->nrows,workspace->st,
                          workspace->end,pIVar4[curr_tree].chosen_cat,model_outputs->missing_action,
                          &st_NA,&end_NA,&split_ix);
    }
  }
  else if (pIVar4[curr_tree].col_type == Numeric) {
    psVar20 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (prediction_data->Xc_indptr == (unsigned_long *)0x0) {
      divide_subset_split<double>
                (psVar20,prediction_data->numeric_data +
                         pIVar4[curr_tree].col_num * prediction_data->nrows,workspace->st,
                 workspace->end,pIVar4[curr_tree].num_split,model_outputs->missing_action,&st_NA,
                 &end_NA,&split_ix);
    }
    else {
      divide_subset_split<double,unsigned_long>
                (psVar20,workspace->st,workspace->end,pIVar4[curr_tree].col_num,prediction_data->Xc,
                 prediction_data->Xc_ind,prediction_data->Xc_indptr,pIVar4[curr_tree].num_split,
                 model_outputs->missing_action,&st_NA,&end_NA,&split_ix);
    }
  }
  uVar18 = workspace->end;
  MVar3 = model_outputs->missing_action;
  if (((model_outputs->new_cat_action == Weighted) && (model_outputs->cat_split_type == SubSet)) &&
     (prediction_data->categ_data != (int *)0x0)) {
    if ((MVar3 == Fail) &&
       ((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
        super__Vector_impl_data._M_start[curr_tree].col_type == Numeric)) {
      st_NA = split_ix;
      end_NA = split_ix;
    }
LAB_0024c7e3:
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (workspace->st < end_NA) {
      pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      std::vector<double,std::allocator<double>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((vector<double,std::allocator<double>> *)&weights_arr,pdVar13,pdVar13 + end_NA);
      puVar14 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ix_arr,puVar14,
                 puVar14 + end_NA);
    }
    if (workspace->st < end_NA) {
      workspace->end = end_NA - 1;
      if (st_NA < end_NA) {
        pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar14 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        sVar21 = st_NA;
        do {
          uVar15 = puVar14[sVar21];
          pdVar13[uVar15] = pIVar4[curr_tree].pct_tree_left * pdVar13[uVar15];
          sVar21 = sVar21 + 1;
        } while (end_NA != sVar21);
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_left,local_70._0_1_);
    }
    pvVar16 = local_70;
    if (st_NA <= uVar18) {
      workspace->st = st_NA;
      workspace->end = uVar18;
      if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start,
                weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
        if ((long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          memmove((workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                    (&weights_arr);
        }
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
          ::_S_do_it(&ix_arr);
        }
      }
      if (st_NA < end_NA) {
        pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar14 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        sVar21 = st_NA;
        do {
          uVar15 = puVar14[sVar21];
          pdVar13[uVar15] = (1.0 - pIVar4[curr_tree].pct_tree_left) * pdVar13[uVar15];
          sVar21 = sVar21 + 1;
        } while (end_NA != sVar21);
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_right,SUB81(pvVar16,0));
    }
    if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    if (MVar3 != Fail) {
      if (MVar3 == Divide) goto LAB_0024c7e3;
      if (MVar3 != Impute) {
        return;
      }
      psVar20 = &st_NA;
      if (0.5 <= (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].pct_tree_left) {
        psVar20 = &end_NA;
      }
      split_ix = *psVar20;
    }
    if (workspace->st < split_ix) {
      workspace->end = split_ix - 1;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_left,local_70._0_1_);
    }
    if (split_ix <= uVar18) {
      workspace->st = split_ix;
      workspace->end = uVar18;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_right,local_70._0_1_);
    }
  }
  return;
}

Assistant:

void traverse_tree_sim(WorkerForSimilarity   &workspace,
                       PredictionData        &prediction_data,
                       IsoForest             &model_outputs,
                       std::vector<IsoTree>  &trees,
                       size_t                curr_tree,
                       const bool            as_kernel)
{
    if (interrupt_switch)
        return;

    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (trees[curr_tree].tree_left == 0)
    {
        ldouble_safe rem = (ldouble_safe) trees[curr_tree].remainder;
        if (workspace.weights_arr.empty())
        {
            if (!as_kernel)
            {
                rem += (ldouble_safe)(workspace.end - workspace.st + 1);
                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows, workspace.rmat.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                        }
                    }
                }
            }
        }

        else
        {
            if (!as_kernel)
            {
                if (!workspace.assume_full_distr)
                {
                    rem += std::accumulate(workspace.ix_arr.begin() + workspace.st,
                                           workspace.ix_arr.begin() + workspace.end,
                                           (ldouble_safe) 0.,
                                           [&workspace](ldouble_safe curr, size_t ix)
                                           {return curr + (ldouble_safe)workspace.weights_arr[ix];}
                                          );
                }

                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.weights_arr.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows,
                                                    workspace.rmat.data(), workspace.weights_arr.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    double w_this;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    double w_this;
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        rmat_this = workspace.rmat.data() + i_*workspace.n_from;
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            rmat_this[j_ - workspace.n_from]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(), -1.);
            else
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.weights_arr.data(), -1.);
        }
        else if (!workspace.rmat.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows, workspace.rmat.data(), -1.);
            else
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows,
                                                workspace.rmat.data(), workspace.weights_arr.data(), -1.);
        }
    }


    /* divide according to tree */
    if (prediction_data.Xc_indptr != NULL && !workspace.tmat_sep.empty())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            if (prediction_data.Xc_indptr == NULL)
                divide_subset_split(workspace.ix_arr.data(),
                                    prediction_data.numeric_data + prediction_data.nrows * trees[curr_tree].col_num,
                                    workspace.st, workspace.end, trees[curr_tree].num_split,
                                    model_outputs.missing_action, st_NA, end_NA, split_ix);
            else
                divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    trees[curr_tree].num_split, model_outputs.missing_action,
                                    st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch(model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }


    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL) {
        if (model_outputs.missing_action == Fail && trees[curr_tree].col_type == Numeric) {
            st_NA = split_ix;
            end_NA = split_ix;
        }
        goto missing_action_divide;
    }
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }

        case Divide: /* new_cat_action = 'Weighted' will also fall here */
        {
            /* TODO: this one should also have a parameter 'changed_weoghts' like during fitting */
            missing_action_divide:
          /* TODO: maybe here it shouldn't copy the whole ix_arr,
             but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.begin(),
                              workspace.ix_arr.begin() + end_NA);
            }

            if (end_NA > workspace.st)
            {
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }

            if (st_NA <= orig_end)
            {
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (!weights_arr.empty())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }
    }
}